

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

void Js::JavascriptOperators::OP_ClearAttributes(Var instance,PropertyId propertyId)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar1;
  bool bVar2;
  RecyclableObject *pRVar3;
  undefined4 *puVar4;
  
  if (instance == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2687,"(instance)","instance");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
    bVar2 = VarIs<Js::RecyclableObject>((Var)0x0);
    if (!bVar2) {
      return;
    }
  }
  else if ((ulong)instance >> 0x30 != 0) {
    return;
  }
  pRVar3 = VarTo<Js::RecyclableObject>(instance);
  UNRECOVERED_JUMPTABLE =
       (pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
       [0x3e];
  (*UNRECOVERED_JUMPTABLE)(pRVar3,propertyId,0,UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void JavascriptOperators::OP_ClearAttributes(Var instance, PropertyId propertyId)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(OP_ClearAttributes);
        Assert(instance);

        if (VarIs<RecyclableObject>(instance))
        {
            RecyclableObject* obj = VarTo<RecyclableObject>(instance);
            obj->SetAttributes(propertyId, PropertyNone);
        }
        JIT_HELPER_END(OP_ClearAttributes);
    }